

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

void __thiscall
mp::VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::apply_precision_options
          (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this,int sol_rnd,int sol_prec
          )

{
  double *pdVar1;
  double *x;
  double *pdVar2;
  double dVar3;
  double dVar4;
  
  if (sol_rnd < 100) {
    this->sol_rnd_ = sol_rnd;
    dVar3 = pow(10.0,(double)sol_rnd);
    pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
      dVar4 = round(*pdVar2 * dVar3);
      *pdVar2 = dVar4 * (1.0 / dVar3);
    }
  }
  if (sol_prec < 100) {
    this->sol_prec_ = sol_prec;
    pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
      dVar3 = round_to_digits<double>(*pdVar2,this->sol_prec_);
      *pdVar2 = dVar3;
    }
  }
  return;
}

Assistant:

void apply_precision_options(
      int sol_rnd, int sol_prec) {
    try {                 // Apply sol_rnd
      if (sol_rnd<100) {
        sol_rnd_ = (sol_rnd);
        auto scale = std::pow(10, sol_rnd_);
        auto scale_rec = 1.0/scale;
        for (auto& x: x_)
          x = std::round(x * scale) * scale_rec;
      }
    } catch (...) { sol_rnd_=100; }     // Could add a warning
    try {                 // Apply sol_prec
      if (sol_prec<100) {
        sol_prec_ = (sol_prec);
        for (auto& x: x_)
          x = round_to_digits(x, sol_prec_);
      }
    } catch (...) { sol_prec_=100; }     // Could add a warning
  }